

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitT(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *__src;
  float *pfVar4;
  int iVar5;
  
  iVar1 = this->vw;
  iVar5 = (-1 << ((this->res).vlog2 & 0x1fU)) + this->v + iVar1;
  if (iVar5 < iVar1) {
    iVar2 = this->u;
    iVar3 = this->uw;
    __src = this->ku;
    pfVar4 = this->kv;
    k->res = this->res;
    k->u = iVar2;
    k->v = 0;
    k->uw = iVar3;
    k->vw = iVar5;
    memcpy(k->kubuff,__src,(long)iVar3 << 2);
    memcpy(k->kvbuff,pfVar4 + ((long)iVar1 - (long)iVar5),(long)iVar5 * 4);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar5 = this->vw - iVar5;
  }
  else {
    operator=(k,this);
    k->v = k->v + (-1 << ((this->res).vlog2 & 0x1fU));
    this->v = 0;
    iVar5 = 0;
  }
  this->vw = iVar5;
  return;
}

Assistant:

void splitT(PtexSeparableKernel& k)
    {
        // split off top piece of width w into k
        int w = v + vw - res.v();
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku  kv
            k.set(res, u, 0, uw, w, ku, kv + vw - w);

            // update local
            vw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v -= res.v();
            v = 0; vw = 0;
        }
    }